

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O1

double opengv::relative_pose::modules::ge::getCost
                 (Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,Matrix3d *yzF,
                 Matrix3d *zxF,Matrix<double,_3,_9,_0,_3,_9> *x1P,Matrix<double,_3,_9,_0,_3,_9> *y1P
                 ,Matrix<double,_3,_9,_0,_3,_9> *z1P,Matrix<double,_3,_9,_0,_3,_9> *x2P,
                 Matrix<double,_3,_9,_0,_3,_9> *y2P,Matrix<double,_3,_9,_0,_3,_9> *z2P,
                 Matrix<double,_9,_9,_0,_9,_9> *m11P,Matrix<double,_9,_9,_0,_9,_9> *m12P,
                 Matrix<double,_9,_9,_0,_9,_9> *m22P,cayley_t *cayley,int step)

{
  Vector4d local_40;
  
  getEV(xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley,&local_40);
  return (double)((ulong)(step == 1) *
                  (long)local_40.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                        m_storage.m_data.array[3] +
                 (ulong)(step != 1) *
                 (ulong)(step == 0) *
                 (long)local_40.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                       m_storage.m_data.array[2]);
}

Assistant:

double
opengv::relative_pose::modules::ge::getCost(
    const Eigen::Matrix3d & xxF,
    const Eigen::Matrix3d & yyF,
    const Eigen::Matrix3d & zzF,
    const Eigen::Matrix3d & xyF,
    const Eigen::Matrix3d & yzF,
    const Eigen::Matrix3d & zxF,
    const Eigen::Matrix<double,3,9> & x1P,
    const Eigen::Matrix<double,3,9> & y1P,
    const Eigen::Matrix<double,3,9> & z1P,
    const Eigen::Matrix<double,3,9> & x2P,
    const Eigen::Matrix<double,3,9> & y2P,
    const Eigen::Matrix<double,3,9> & z2P,
    const Eigen::Matrix<double,9,9> & m11P,
    const Eigen::Matrix<double,9,9> & m12P,
    const Eigen::Matrix<double,9,9> & m22P,
    const cayley_t & cayley,
    int step )
{
  Eigen::Vector4d roots;
  getEV(xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley,roots);
  
  double cost = 0.0;
  
  if( step == 0 )
    cost = roots[2];
  if( step == 1 )
    cost = roots[3];
  
  return cost;
}